

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.hpp
# Opt level: O1

void __thiscall
Diligent::TextureBase<Diligent::EngineVkImplTraits>::TextureBase
          (TextureBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          TexViewObjAllocatorType *TexViewObjAllocator,RenderDeviceImplType *pDevice,
          TextureDesc *Desc,bool bIsDeviceInternal)

{
  Uint64 *pUVar1;
  RESOURCE_DIMENSION RVar2;
  BIND_FLAGS BVar3;
  ulong uVar4;
  Uint32 UVar5;
  RenderDeviceVkImpl *pRVar6;
  ulong uVar7;
  string msg;
  char (*in_stack_ffffffffffffffc0) [35];
  string local_38;
  size_t local_18;
  
  DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>::
  DeviceObjectBase(&this->
                    super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                   ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>)
  .super_ObjectBase<Diligent::ITextureVk>.super_RefCountedObject<Diligent::ITextureVk>.
  super_ITextureVk.super_ITexture.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_00b010d8;
  this->m_pDefaultViews = (void *)0x0;
  this->m_dbgTexViewObjAllocator = TexViewObjAllocator;
  (this->m_ViewIndices)._M_elems[0] = '\0';
  (this->m_ViewIndices)._M_elems[1] = '\0';
  (this->m_ViewIndices)._M_elems[2] = '\0';
  (this->m_ViewIndices)._M_elems[3] = '\0';
  (this->m_ViewIndices)._M_elems[3] = '\0';
  (this->m_ViewIndices)._M_elems[4] = '\0';
  (this->m_ViewIndices)._M_elems[5] = '\0';
  (this->m_ViewIndices)._M_elems[6] = '\0';
  this->m_State = RESOURCE_STATE_UNKNOWN;
  (this->m_pSparseProps)._M_t.
  super___uniq_ptr_impl<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::SparseTextureProperties_*,_std::default_delete<Diligent::SparseTextureProperties>_>
  .super__Head_base<0UL,_Diligent::SparseTextureProperties_*,_false>._M_head_impl =
       (SparseTextureProperties *)0x0;
  (this->m_ViewIndices)._M_elems[0] = 0xff;
  (this->m_ViewIndices)._M_elems[1] = 0xff;
  (this->m_ViewIndices)._M_elems[2] = 0xff;
  (this->m_ViewIndices)._M_elems[3] = 0xff;
  (this->m_ViewIndices)._M_elems[3] = 0xff;
  (this->m_ViewIndices)._M_elems[4] = 0xff;
  (this->m_ViewIndices)._M_elems[5] = 0xff;
  (this->m_ViewIndices)._M_elems[6] = 0xff;
  if ((this->
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      ).m_Desc.MipLevels != 0) goto LAB_00246ede;
  RVar2 = (this->
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          ).m_Desc.Type;
  if ((RVar2 & ~RESOURCE_DIM_BUFFER) == RESOURCE_DIM_TEX_1D) {
    UVar5 = ComputeMipLevelsCount
                      ((this->
                       super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                       ).m_Desc.Width);
  }
  else {
    if (RESOURCE_DIM_TEX_CUBE_ARRAY < RVar2) {
LAB_00246fd3:
      FormatString<char[21]>(&local_38,(char (*) [21])"Unknown texture type");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"TextureBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                 ,0x80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00246ede;
    }
    if ((0x1b0U >> (RVar2 & 0x1f) & 1) == 0) {
      if (RVar2 != 6) goto LAB_00246fd3;
      UVar5 = ComputeMipLevelsCount
                        ((this->
                         super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                         ).m_Desc.Width,
                         (this->
                         super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                         ).m_Desc.Height,
                         (this->
                         super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                         ).m_Desc.field_3.ArraySize);
    }
    else {
      UVar5 = ComputeMipLevelsCount
                        ((this->
                         super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                         ).m_Desc.Width,
                         (this->
                         super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                         ).m_Desc.Height);
    }
  }
  (this->
  super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>)
  .m_Desc.MipLevels = UVar5;
LAB_00246ede:
  pRVar6 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                      );
  uVar4 = (pRVar6->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).m_CmdQueueCount;
  uVar7 = ~(-1L << ((byte)uVar4 & 0x3f));
  if (0x3f < uVar4) {
    uVar7 = 0xffffffffffffffff;
  }
  if (((this->
       super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
       ).m_Desc.ImmediateContextMask & uVar7) == 0) {
    pRVar6 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             ::GetDevice(&this->
                          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        );
    local_18 = (pRVar6->
               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
               ).m_CmdQueueCount;
    FormatString<char[42],std::ios_base&(std::ios_base&),unsigned_long,char[24],unsigned_long,char[35]>
              (&local_38,(Diligent *)"No bits in the immediate context mask (0x",
               (char (*) [42])std::hex,
               (_func_ios_base_ptr_ios_base_ptr *)
               &(this->
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                ).m_Desc.ImmediateContextMask,(unsigned_long *)") correspond to one of ",
               (char (*) [24])&local_18,(unsigned_long *)" available software command queues",
               in_stack_ffffffffffffffc0);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"TextureBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0x87);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  pUVar1 = &(this->
            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            ).m_Desc.ImmediateContextMask;
  *pUVar1 = *pUVar1 & uVar7;
  pRVar6 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                      );
  ValidateTextureDesc(&(this->
                       super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                       ).m_Desc,(IRenderDevice *)pRVar6);
  BVar3 = (this->
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          ).m_Desc.BindFlags;
  if ((BVar3 >> 9 & 1) != 0) {
    (this->
    super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
    ).m_Desc.BindFlags = BVar3 | BIND_SHADER_RESOURCE;
  }
  return;
}

Assistant:

TextureBase(IReferenceCounters*      pRefCounters,
                TexViewObjAllocatorType& TexViewObjAllocator,
                RenderDeviceImplType*    pDevice,
                const TextureDesc&       Desc,
                bool                     bIsDeviceInternal = false) :
        // clang-format off
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal}
#ifdef DILIGENT_DEBUG
        , m_dbgTexViewObjAllocator{TexViewObjAllocator}
#endif
    // clang-format on
    {
        m_ViewIndices.fill(Uint8{InvalidViewIndex});

        if (this->m_Desc.MipLevels == 0)
        {
            // Compute the number of levels in the full mipmap chain
            if (this->m_Desc.Is1D())
            {
                this->m_Desc.MipLevels = ComputeMipLevelsCount(this->m_Desc.Width);
            }
            else if (this->m_Desc.Is2D())
            {
                this->m_Desc.MipLevels = ComputeMipLevelsCount(this->m_Desc.Width, this->m_Desc.Height);
            }
            else if (this->m_Desc.Is3D())
            {
                this->m_Desc.MipLevels = ComputeMipLevelsCount(this->m_Desc.Width, this->m_Desc.Height, this->m_Desc.Depth);
            }
            else
            {
                UNEXPECTED("Unknown texture type");
            }
        }

        Uint64 DeviceQueuesMask = this->GetDevice()->GetCommandQueueMask();
        DEV_CHECK_ERR((this->m_Desc.ImmediateContextMask & DeviceQueuesMask) != 0,
                      "No bits in the immediate context mask (0x", std::hex, this->m_Desc.ImmediateContextMask,
                      ") correspond to one of ", this->GetDevice()->GetCommandQueueCount(), " available software command queues");
        this->m_Desc.ImmediateContextMask &= DeviceQueuesMask;

        // Validate correctness of texture description
        ValidateTextureDesc(this->m_Desc, this->GetDevice());

        if ((this->m_Desc.BindFlags & BIND_INPUT_ATTACHMENT) != 0)
            this->m_Desc.BindFlags |= BIND_SHADER_RESOURCE;
    }